

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_amigahunk.c
# Opt level: O2

char * gethunkname(HunkInfo *hi)

{
  uint32_t uVar1;
  char *__dest;
  uint n;
  
  uVar1 = nextword32(hi);
  n = uVar1 & 0xffffff;
  if (n == 0) {
    __dest = (char *)0x0;
  }
  else {
    __dest = (char *)alloczero((ulong)(n * 4 + 4));
    strncpy(__dest,(char *)hi->hunkptr,(ulong)(n * 4));
    movehunkptr32(hi,n);
  }
  return __dest;
}

Assistant:

static char *gethunkname(struct HunkInfo *hi)
/* read 32-bit aligned name, the most significant byte of the */
/* length specifier is ignored (for HUNK_EXT names, for example) */
{
  uint32_t n;
  char *s=NULL;

  if (n = nextword32(hi) & 0xffffff) {  /* name given? */
    s = alloczero((n+1)<<2);
    strncpy(s,(char *)hi->hunkptr,n<<2);
    movehunkptr32(hi,n);
  }
  return s;
}